

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

bool __thiscall
bssl::ssl_encrypt_client_hello(bssl *this,SSL_HANDSHAKE *hs,Span<const_unsigned_char> enc)

{
  EVP_HPKE_CTX *ctx;
  bssl value;
  bssl *this_00;
  uchar *puVar1;
  Span<const_unsigned_char> in;
  uchar *in_00;
  char cVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  size_t *out_binder_len;
  uint8_t *puVar7;
  CBB *pCVar8;
  size_t sVar9;
  size_t sVar10;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *pEVar11;
  EVP_AEAD *pEVar12;
  size_t sVar13;
  size_t ad_len;
  long lVar14;
  ulong uVar15;
  Span<unsigned_char> msg;
  Span<const_unsigned_char> in_01;
  bool needs_psk_binder;
  SSLTranscript *local_188;
  CBB *pCStack_180;
  ScopedCBB cbb;
  Array<unsigned_char> encoded;
  size_t payload_len;
  ScopedCBB encoded_cbb;
  ScopedCBB aad;
  CBB enc_cbb;
  CBB body;
  CBB payload_cbb;
  
  this_00 = *(bssl **)this;
  if (*(long *)(this + 0x6a0) == 0) {
    if (*(ushort *)(this + 0x1e) < 0x304) {
      return true;
    }
    if ((*(byte *)(*(long *)(this + 8) + 0x10d) & 1) == 0) {
      return true;
    }
    if ((*(ushort *)(*(long *)(this_00 + 8) + 0x10d) >> 0xb & 1) == 0) {
      uVar6 = EVP_has_aes_hardware();
    }
    else {
      uVar6 = *(ushort *)(*(long *)(this_00 + 8) + 0x10d) >> 0xc & 1;
    }
    if (uVar6 == 0) {
      pEVar11 = EVP_hpke_chacha20_poly1305();
    }
    else {
      pEVar11 = EVP_hpke_aes_128_gcm();
    }
    value = this[0x6fc];
    X25519_keypair((uint8_t *)&enc_cbb,(uint8_t *)&payload_cbb);
    RAND_bytes((uchar *)&cbb,8);
    pEVar12 = EVP_HPKE_AEAD_aead(pEVar11);
    sVar10 = EVP_AEAD_max_overhead(pEVar12);
    CBB_zero(&cbb.ctx_);
    iVar5 = CBB_init(&cbb.ctx_,0x100);
    if ((iVar5 != 0) && (iVar5 = CBB_add_u16(&cbb.ctx_,1), iVar5 != 0)) {
      uVar4 = EVP_HPKE_AEAD_id(pEVar11);
      iVar5 = CBB_add_u16(&cbb.ctx_,uVar4);
      if ((iVar5 != 0) &&
         ((((iVar5 = CBB_add_u8(&cbb.ctx_,(uint8_t)value), iVar5 != 0 &&
            (iVar5 = CBB_add_u16_length_prefixed(&cbb.ctx_,&encoded_cbb.ctx_), iVar5 != 0)) &&
           (iVar5 = CBB_add_bytes(&encoded_cbb.ctx_,(uint8_t *)&enc_cbb,0x20), iVar5 != 0)) &&
          (iVar5 = CBB_add_u16_length_prefixed(&cbb.ctx_,&body), iVar5 != 0)))) {
        sVar10 = sVar10 + (((uint)cbb.ctx_.child & 3) << 5) + 0x80;
        iVar5 = CBB_add_space(&body,(uint8_t **)&aad,sVar10);
        if ((iVar5 != 0) && (iVar5 = RAND_bytes((uchar *)aad.ctx_.child,(int)sVar10), iVar5 != 0)) {
          bVar3 = CBBFinishArray(&cbb.ctx_,(Array<unsigned_char> *)(this + 0x2a8));
          goto LAB_0013648b;
        }
      }
    }
    bVar3 = false;
LAB_0013648b:
    CBB_cleanup(&cbb.ctx_);
    return bVar3;
  }
  CBB_zero(&cbb.ctx_);
  CBB_zero(&encoded_cbb.ctx_);
  local_188 = (SSLTranscript *)0x0;
  pCStack_180 = (CBB *)0x0;
  cVar2 = (**(code **)(*(long *)this_00 + 0x58))(this_00,&cbb,&body);
  if (((cVar2 != '\0') && (iVar5 = CBB_init(&encoded_cbb.ctx_,0x100), iVar5 != 0)) &&
     ((bVar3 = ssl_write_client_hello_without_extensions
                         ((SSL_HANDSHAKE *)this,&body,ssl_client_hello_inner,false), bVar3 &&
      (bVar3 = ssl_write_client_hello_without_extensions
                         ((SSL_HANDSHAKE *)this,&encoded_cbb.ctx_,ssl_client_hello_inner,true),
      bVar3)))) {
    out_binder_len = (size_t *)CBB_len(&body);
    bVar3 = ssl_add_clienthello_tlsext
                      ((SSL_HANDSHAKE *)this,&body,&encoded_cbb.ctx_,&needs_psk_binder,
                       ssl_client_hello_inner,(size_t)out_binder_len);
    if ((bVar3) &&
       (cVar2 = (**(code **)(*(long *)this_00 + 0x60))(this_00,&cbb,&local_188), cVar2 != '\0')) {
      if (needs_psk_binder == true) {
        msg.size_ = (size_t)&enc_cbb;
        msg.data_ = (uchar *)pCStack_180;
        bVar3 = tls13_write_psk_binder
                          (this,(SSL_HANDSHAKE *)(this + 0x238),local_188,msg,out_binder_len);
        if (bVar3) {
          puVar7 = CBB_data(&encoded_cbb.ctx_);
          pCVar8 = (CBB *)CBB_len(&encoded_cbb.ctx_);
          if (pCVar8 < enc_cbb.child) {
            abort();
          }
          if (pCStack_180 < enc_cbb.child) {
            abort();
          }
          if (enc_cbb.child != (CBB *)0x0) {
            memcpy(puVar7 + (long)pCVar8 + -(long)enc_cbb.child,
                   (uchar *)((long)local_188 + ((long)&pCStack_180->child - (long)enc_cbb.child)),
                   (size_t)enc_cbb.child);
          }
          goto LAB_00136237;
        }
      }
      else {
LAB_00136237:
        in_01.size_ = (size_t)out_binder_len;
        in_01.data_ = (uchar *)pCStack_180;
        ssl_do_msg_callback(this_00,(SSL *)0x1,0x101,(int)local_188,in_01);
        in.size_ = (size_t)pCStack_180;
        in.data_ = (uchar *)local_188;
        bVar3 = SSLTranscript::Update((SSLTranscript *)(this + 0x238),in);
        if (bVar3) {
          uVar15 = (ulong)*(byte *)(*(long *)(this + 0x6a0) + 0x42);
          if (*(char **)(this_00 + 0x90) == (char *)0x0) {
            lVar14 = uVar15 + 9;
          }
          else {
            sVar9 = strlen(*(char **)(this_00 + 0x90));
            lVar14 = 0;
            if (sVar9 <= uVar15) {
              lVar14 = uVar15 - sVar9;
            }
          }
          sVar10 = CBB_len(&encoded_cbb.ctx_);
          encoded.data_ = (uchar *)0x0;
          encoded.size_ = 0;
          iVar5 = CBB_add_zeros(&encoded_cbb.ctx_,
                                (ulong)(-((int)sVar10 + (int)lVar14) & 0x1f) + lVar14);
          if ((iVar5 == 0) || (bVar3 = CBBFinishArray(&encoded_cbb.ctx_,&encoded), !bVar3)) {
LAB_00136731:
            bVar3 = false;
          }
          else {
            ctx = (EVP_HPKE_CTX *)(this + 0x350);
            kdf = EVP_HPKE_CTX_kdf(ctx);
            pEVar11 = EVP_HPKE_CTX_aead(ctx);
            sVar10 = encoded.size_;
            pEVar12 = EVP_HPKE_AEAD_aead(pEVar11);
            sVar13 = EVP_AEAD_max_overhead(pEVar12);
            sVar13 = sVar13 + sVar10;
            payload_len = sVar13;
            iVar5 = CBB_init(&cbb.ctx_,0x100);
            if (iVar5 == 0) goto LAB_00136731;
            uVar4 = EVP_HPKE_KDF_id(kdf);
            iVar5 = CBB_add_u16(&cbb.ctx_,uVar4);
            if (iVar5 == 0) goto LAB_00136731;
            uVar4 = EVP_HPKE_AEAD_id(pEVar11);
            iVar5 = CBB_add_u16(&cbb.ctx_,uVar4);
            if ((((iVar5 == 0) ||
                 (iVar5 = CBB_add_u8(&cbb.ctx_,*(uint8_t *)(*(long *)(this + 0x6a0) + 0x43)),
                 iVar5 == 0)) ||
                (iVar5 = CBB_add_u16_length_prefixed(&cbb.ctx_,&enc_cbb), iVar5 == 0)) ||
               (((iVar5 = CBB_add_bytes(&enc_cbb,(uint8_t *)hs,(size_t)enc.data_), iVar5 == 0 ||
                 (iVar5 = CBB_add_u16_length_prefixed(&cbb.ctx_,&payload_cbb), iVar5 == 0)) ||
                (iVar5 = CBB_add_zeros(&payload_cbb,sVar13), iVar5 == 0)))) goto LAB_00136731;
            bVar3 = CBBFinishArray(&cbb.ctx_,(Array<unsigned_char> *)(this + 0x2a8));
            if (!bVar3) goto LAB_00136731;
            CBB_zero(&aad.ctx_);
            iVar5 = CBB_init(&aad.ctx_,0x100);
            if ((iVar5 == 0) ||
               (bVar3 = ssl_write_client_hello_without_extensions
                                  ((SSL_HANDSHAKE *)this,&aad.ctx_,ssl_client_hello_outer,false),
               !bVar3)) {
LAB_00136742:
              bVar3 = false;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0x36e);
            }
            else {
              sVar10 = CBB_len(&aad.ctx_);
              bVar3 = ssl_add_clienthello_tlsext
                                ((SSL_HANDSHAKE *)this,&aad.ctx_,(CBB *)0x0,&needs_psk_binder,
                                 ssl_client_hello_outer,sVar10);
              sVar10 = encoded.size_;
              in_00 = encoded.data_;
              if (!bVar3) goto LAB_00136742;
              if (needs_psk_binder == true) {
                __assert_fail("!needs_psk_binder",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                              ,0x374,
                              "bool bssl::ssl_encrypt_client_hello(SSL_HANDSHAKE *, Span<const uint8_t>)"
                             );
              }
              uVar15 = *(ulong *)(this + 0x2b0);
              if (uVar15 < sVar13) {
                abort();
              }
              puVar1 = ((Array<unsigned_char> *)(this + 0x2a8))->data_;
              puVar7 = CBB_data(&aad.ctx_);
              ad_len = CBB_len(&aad.ctx_);
              iVar5 = EVP_HPKE_CTX_seal(ctx,puVar1 + (uVar15 - sVar13),&payload_len,sVar13,in_00,
                                        sVar10,puVar7,ad_len);
              bVar3 = payload_len == sVar13 && iVar5 != 0;
            }
            CBB_cleanup(&aad.ctx_);
          }
          Array<unsigned_char>::~Array(&encoded);
          goto LAB_001362c2;
        }
      }
      bVar3 = false;
      goto LAB_001362c2;
    }
  }
  bVar3 = false;
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,800);
LAB_001362c2:
  OPENSSL_free(local_188);
  CBB_cleanup(&encoded_cbb.ctx_);
  CBB_cleanup(&cbb.ctx_);
  return bVar3;
}

Assistant:

bool ssl_encrypt_client_hello(SSL_HANDSHAKE *hs, Span<const uint8_t> enc) {
  SSL *const ssl = hs->ssl;
  if (!hs->selected_ech_config) {
    return setup_ech_grease(hs);
  }

  // Construct ClientHelloInner and EncodedClientHelloInner. See
  // draft-ietf-tls-esni-13, sections 5.1 and 6.1.
  ScopedCBB cbb, encoded_cbb;
  CBB body;
  bool needs_psk_binder;
  Array<uint8_t> hello_inner;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !CBB_init(encoded_cbb.get(), 256) ||
      !ssl_write_client_hello_without_extensions(hs, &body,
                                                 ssl_client_hello_inner,
                                                 /*empty_session_id=*/false) ||
      !ssl_write_client_hello_without_extensions(hs, encoded_cbb.get(),
                                                 ssl_client_hello_inner,
                                                 /*empty_session_id=*/true) ||
      !ssl_add_clienthello_tlsext(hs, &body, encoded_cbb.get(),
                                  &needs_psk_binder, ssl_client_hello_inner,
                                  CBB_len(&body)) ||
      !ssl->method->finish_message(ssl, cbb.get(), &hello_inner)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (needs_psk_binder) {
    size_t binder_len;
    if (!tls13_write_psk_binder(hs, hs->inner_transcript, Span(hello_inner),
                                &binder_len)) {
      return false;
    }
    // Also update the EncodedClientHelloInner.
    auto encoded_binder =
        Span(const_cast<uint8_t *>(CBB_data(encoded_cbb.get())),
             CBB_len(encoded_cbb.get()))
            .last(binder_len);
    auto hello_inner_binder = Span(hello_inner).last(binder_len);
    OPENSSL_memcpy(encoded_binder.data(), hello_inner_binder.data(),
                   binder_len);
  }

  ssl_do_msg_callback(ssl, /*is_write=*/1, SSL3_RT_CLIENT_HELLO_INNER,
                      hello_inner);
  if (!hs->inner_transcript.Update(hello_inner)) {
    return false;
  }

  // Pad the EncodedClientHelloInner. See draft-ietf-tls-esni-13, section 6.1.3.
  size_t padding_len = 0;
  size_t maximum_name_length = hs->selected_ech_config->maximum_name_length;
  if (ssl->hostname) {
    size_t hostname_len = strlen(ssl->hostname.get());
    if (hostname_len <= maximum_name_length) {
      padding_len = maximum_name_length - hostname_len;
    }
  } else {
    // No SNI. Pad up to |maximum_name_length|, including server_name extension
    // overhead.
    padding_len = 9 + maximum_name_length;
  }
  // Pad the whole thing to a multiple of 32 bytes.
  padding_len += 31 - ((CBB_len(encoded_cbb.get()) + padding_len - 1) % 32);
  Array<uint8_t> encoded;
  if (!CBB_add_zeros(encoded_cbb.get(), padding_len) ||
      !CBBFinishArray(encoded_cbb.get(), &encoded)) {
    return false;
  }

  // Encrypt |encoded|. See draft-ietf-tls-esni-13, section 6.1.1. First,
  // assemble the extension with a placeholder value for ClientHelloOuterAAD.
  // See draft-ietf-tls-esni-13, section 5.2.
  const EVP_HPKE_KDF *kdf = EVP_HPKE_CTX_kdf(hs->ech_hpke_ctx.get());
  const EVP_HPKE_AEAD *aead = EVP_HPKE_CTX_aead(hs->ech_hpke_ctx.get());
  size_t payload_len = encoded.size() + aead_overhead(aead);
  CBB enc_cbb, payload_cbb;
  if (!CBB_init(cbb.get(), 256) ||
      !CBB_add_u16(cbb.get(), EVP_HPKE_KDF_id(kdf)) ||
      !CBB_add_u16(cbb.get(), EVP_HPKE_AEAD_id(aead)) ||
      !CBB_add_u8(cbb.get(), hs->selected_ech_config->config_id) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &enc_cbb) ||
      !CBB_add_bytes(&enc_cbb, enc.data(), enc.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &payload_cbb) ||
      !CBB_add_zeros(&payload_cbb, payload_len) ||
      !CBBFinishArray(cbb.get(), &hs->ech_client_outer)) {
    return false;
  }

  // Construct ClientHelloOuterAAD.
  // TODO(https://crbug.com/boringssl/275): This ends up constructing the
  // ClientHelloOuter twice. Instead, reuse |aad| for the ClientHello, now that
  // draft-12 made the length prefixes match.
  bssl::ScopedCBB aad;
  if (!CBB_init(aad.get(), 256) ||
      !ssl_write_client_hello_without_extensions(hs, aad.get(),
                                                 ssl_client_hello_outer,
                                                 /*empty_session_id=*/false) ||
      !ssl_add_clienthello_tlsext(hs, aad.get(), /*out_encoded=*/nullptr,
                                  &needs_psk_binder, ssl_client_hello_outer,
                                  CBB_len(aad.get()))) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // ClientHelloOuter may not require a PSK binder. Otherwise, we have a
  // circular dependency.
  assert(!needs_psk_binder);

  // Replace the payload in |hs->ech_client_outer| with the encrypted value.
  auto payload_span = Span(hs->ech_client_outer).last(payload_len);
  if (CRYPTO_fuzzer_mode_enabled()) {
    // In fuzzer mode, the server expects a cleartext payload.
    assert(payload_span.size() == encoded.size());
    OPENSSL_memcpy(payload_span.data(), encoded.data(), encoded.size());
  } else {
    if (!EVP_HPKE_CTX_seal(hs->ech_hpke_ctx.get(), payload_span.data(),
                           &payload_len, payload_span.size(), encoded.data(),
                           encoded.size(), CBB_data(aad.get()),
                           CBB_len(aad.get())) ||
        payload_len != payload_span.size()) {
      return false;
    }
  }

  return true;
}